

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placalc.cpp
# Opt level: O3

void __thiscall placalc::LoadPostLossAmplificationFactors(placalc *this,float secondaryFactor)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  size_t sVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  char *this_00;
  placalc *this_01;
  float extraout_XMM0_Da;
  float in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  event_count ec;
  event_amplification ea;
  amplification_factor af;
  int opts;
  undefined4 uStack_e8;
  int iStack_e4;
  float fStack_e0;
  int iStack_dc;
  int iStack_d8;
  uint uStack_d4;
  float fStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  key_type kStack_b8;
  float fStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined1 local_58 [4];
  int local_54;
  key_type local_50;
  int local_48;
  float local_44;
  double local_40;
  undefined1 local_34 [4];
  
  this_00 = "static/lossfactors.bin";
  __stream = fopen("static/lossfactors.bin","rb");
  if (__stream != (FILE *)0x0) {
    sVar4 = fread(local_34,4,1,__stream);
    if ((sVar4 != 0) && (sVar4 = fread(local_58,8,1,__stream), sVar4 != 0)) {
      local_40 = (double)secondaryFactor;
      iVar2 = local_54;
      do {
        for (; iVar2 != 0; iVar2 = iVar2 + -1) {
          sVar4 = fread(&local_48,8,1,__stream);
          if (sVar4 == 0) {
            return;
          }
          local_50.amplification_id = local_48;
          dVar1 = ((double)local_44 + -1.0) * local_40;
          pmVar5 = std::__detail::
                   _Map_base<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)factors_,&local_50);
          *pmVar5 = (float)(dVar1 + 1.0);
        }
        sVar4 = fread(local_58,8,1,__stream);
        iVar2 = local_54;
      } while (sVar4 != 0);
    }
    return;
  }
  LoadPostLossAmplificationFactors();
  fStack_d0 = in_XMM1_Da;
  uStack_cc = in_XMM1_Db;
  uStack_c8 = in_XMM1_Dc;
  uStack_c4 = in_XMM1_Dd;
  fStack_b0 = extraout_XMM0_Da;
  LoadItemToAmplification();
  if ((fStack_d0 == 0.0) && (!NAN(fStack_d0))) {
    LoadPostLossAmplificationFactors((placalc *)this_00,fStack_b0);
  }
  uStack_d4 = 0;
  fread(&uStack_d4,4,1,_stdin);
  this_01 = (placalc *)(ulong)uStack_d4;
  uVar3 = 0x1000000;
  if ((uStack_d4 >> 0x18 & 1) == 0) {
    uVar3 = uStack_d4 & 0x2000000;
  }
  if ((uVar3 != 0x1000000) && (uVar3 != 0x2000000)) {
    doit(this_01);
    if (*(void **)this_01 != (void *)0x0) {
      operator_delete(*(void **)this_01);
      return;
    }
    return;
  }
  fwrite(&uStack_d4,4,1,_stdout);
  uStack_e8 = 0;
  sVar4 = fread(&uStack_e8,4,1,_stdin);
  if (sVar4 == 0) {
    doit((placalc *)&uStack_e8);
  }
  else {
    fwrite(&uStack_e8,4,1,_stdout);
    sVar4 = fread(&iStack_dc,8,1,_stdin);
    if (sVar4 != 0) {
      fStack_b0 = (float)(~-(uint)(fStack_d0 == 0.0) & (uint)fStack_d0 |
                         -(uint)(fStack_d0 == 0.0) & 0x3f800000);
      uStack_ac = uStack_cc;
      uStack_a8 = uStack_c8;
      uStack_a4 = uStack_c4;
      do {
        fwrite(&iStack_dc,8,1,_stdout);
        kStack_b8.event_id = iStack_dc;
        kStack_b8.amplification_id = *(int *)(item_to_amplification_ + (long)iStack_d8 * 4);
        iVar6 = std::
                _Hashtable<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)factors_,&kStack_b8);
        fStack_d0 = fStack_b0;
        if (iVar6.super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>.
            _M_cur != (__node_type *)0x0) {
          fStack_d0 = *(float *)((long)iVar6.
                                       super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>
                                       ._M_cur + 0x10);
        }
        do {
          sVar4 = fread(&iStack_e4,8,1,_stdin);
          if (sVar4 == 0) {
            return;
          }
          fStack_e0 = fStack_e0 * fStack_d0;
          fwrite(&iStack_e4,8,1,_stdout);
        } while (iStack_e4 != 0);
        sVar4 = fread(&iStack_dc,8,1,_stdin);
      } while (sVar4 != 0);
    }
  }
  return;
}

Assistant:

void LoadPostLossAmplificationFactors(const float secondaryFactor) {

    FILE *fin = fopen(PLAFACTORS_FILE, "rb");
    if (fin == nullptr) {
      fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__,
	      PLAFACTORS_FILE);
      exit(EXIT_FAILURE);
    }

    int opts;
    size_t i = fread(&opts, sizeof(opts), 1, fin);

    event_count ec;
    amplification_factor af;
    while (i != 0) {
      i = fread(&ec, sizeof(ec), 1, fin);
      if (i == 0) break;
      event_amplification ea;
      ea.event_id = ec.event_id;
      for (int amplification = 0; amplification != ec.count; ++amplification) {
	i = fread(&af, sizeof(af), 1, fin);
	if (i == 0) break;
	ea.amplification_id = af.amplification_id;
	factors_[ea] = 1. + (af.factor - 1.) * secondaryFactor;
      }
    }

  }